

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O0

void __thiscall nodecpp::platform::internal_msg::InternalMsg::impl_clear(InternalMsg *this)

{
  EVP_PKEY_CTX *ctx;
  anon_class_8_1_8991fb9c local_18;
  InternalMsg *local_10;
  InternalMsg *this_local;
  
  local_10 = this;
  implReleaseAllPages(this);
  ctx = (EVP_PKEY_CTX *)0x180;
  local_18.this = this;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::impl_clear()::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
             ,0x180,&local_18,"pageCnt == 0");
  PagePtrWrapper::init((PagePtrWrapper *)this,ctx);
  PagePtrWrapper::init(&this->lip,ctx);
  PagePtrWrapper::init(&this->currentPage,ctx);
  this->totalSz = 0;
  return;
}

Assistant:

void impl_clear() 
		{
			implReleaseAllPages();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, pageCnt == 0 );
			firstHeader.next_.init();
			lip.init();
			currentPage.init();
			totalSz = 0;
		}